

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_selection_vec4(ShaderEvalContext *c)

{
  undefined8 uVar1;
  float *pfVar2;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float fStack_c;
  float fStack_8;
  float fStack_4;
  
  local_10 = c->in[1].m_data[3];
  fStack_c = c->in[1].m_data[2];
  fStack_8 = c->in[1].m_data[1];
  fStack_4 = c->in[1].m_data[0];
  local_20 = c->in[2].m_data[0];
  local_1c = c->in[2].m_data[3];
  local_18 = c->in[2].m_data[2];
  local_14 = c->in[2].m_data[1];
  pfVar2 = &local_20;
  if (0.0 < c->in[0].m_data[2]) {
    pfVar2 = &local_10;
  }
  uVar1 = *(undefined8 *)(pfVar2 + 2);
  *(undefined8 *)(c->color).m_data = *(undefined8 *)pfVar2;
  *(undefined8 *)((c->color).m_data + 2) = uVar1;
  return;
}

Assistant:

void eval_selection_vec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(3, 2, 1, 0),	c.in[2].swizzle(0, 3, 2, 1)); }